

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlListPtr xmlGetRefs(xmlDocPtr doc,xmlChar *ID)

{
  xmlRefTablePtr table;
  xmlChar *ID_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if (ID == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if ((xmlHashTablePtr)doc->refs == (xmlHashTablePtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)xmlHashLookup((xmlHashTablePtr)doc->refs,ID);
  }
  return (xmlListPtr)doc_local;
}

Assistant:

xmlListPtr
xmlGetRefs(xmlDocPtr doc, const xmlChar *ID) {
    xmlRefTablePtr table;

    if (doc == NULL) {
        return(NULL);
    }

    if (ID == NULL) {
        return(NULL);
    }

    table = (xmlRefTablePtr) doc->refs;
    if (table == NULL)
        return(NULL);

    return (xmlHashLookup(table, ID));
}